

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_error.hpp
# Opt level: O1

string * __thiscall
jsoncons::jsonpath::jsonpath_error_category_impl::message_abi_cxx11_
          (string *__return_storage_ptr__,jsonpath_error_category_impl *this,int ev)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(ev) {
  case 1:
    pcVar2 = "Expected \'$\' or \'@\'";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Expected \'[\' or \'.\'";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "Expected \'\'\' or digit";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "Expected \'$\' or function expression";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "Expected @";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "Expected )";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "Expected ]";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "Expected dot or left bracket separator";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "Invalid path filter, expected \'/\'";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "Expected slice start";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "Expected slice end";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "Expected slice step";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = 
    "Expected index, single or double quoted name, expression, filter, absolute (\'$\') path or relative (\'@\') path"
    ;
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Unknown jsonpath parser error";
    pcVar1 = "";
    break;
  case 0xf:
    pcVar2 = "Invalid function name";
    pcVar1 = "";
    break;
  case 0x10:
    pcVar2 = "Invalid argument type";
    pcVar1 = "";
    break;
  case 0x11:
    pcVar2 = "Incorrect number of arguments";
    pcVar1 = "";
    break;
  case 0x12:
    pcVar2 = "Function name not found";
    pcVar1 = "";
    break;
  case 0x13:
    pcVar2 = "Could not parse JSON expression in a JSONPath filter";
    pcVar1 = "";
    break;
  case 0x14:
    pcVar2 = "Could not parse JSON expression passed to JSONPath function";
    pcVar1 = "";
    break;
  case 0x15:
    pcVar2 = "Unidentified error";
    pcVar1 = "";
    break;
  case 0x16:
    pcVar2 = "Unexpected EOF while parsing jsonpath expression";
    pcVar1 = "";
    break;
  case 0x17:
    pcVar2 = "Expected \':\', \'.\', \'[\', \',\', or \']\'";
    pcVar1 = "";
    break;
  case 0x18:
    pcVar2 = "Argument to unflatten must be an object";
    pcVar1 = "";
    break;
  case 0x19:
    pcVar2 = "Flattened key is invalid";
    pcVar1 = "";
    break;
  case 0x1a:
    pcVar2 = "Slice step cannot be zero";
    pcVar1 = "";
    break;
  case 0x1b:
    pcVar2 = "Invalid number";
    pcVar1 = "";
    break;
  case 0x1c:
    pcVar2 = "Illegal escaped character";
    pcVar1 = "";
    break;
  case 0x1d:
    pcVar2 = "Invalid codepoint";
    pcVar1 = "";
    break;
  case 0x1e:
    pcVar2 = "Unknown function";
    pcVar1 = "";
    break;
  case 0x1f:
    pcVar2 = "Invalid type";
    pcVar1 = "";
    break;
  case 0x20:
    pcVar2 = "Unbalanced parentheses";
    pcVar1 = "";
    break;
  case 0x21:
    pcVar2 = "Syntax error";
    pcVar1 = "";
    break;
  case 0x22:
    pcVar2 = "Expected comparator";
    pcVar1 = "";
    break;
  case 0x23:
    pcVar2 = "Expected operator \'||\'";
    pcVar1 = "";
    break;
  case 0x24:
    pcVar2 = "Expected operator \'&&\'";
    pcVar1 = "";
    break;
  case 0x25:
    pcVar2 = "Expected comma or right parenthesis";
    pcVar1 = "";
    break;
  case 0x26:
    pcVar2 = "Expected comma or right bracket";
    pcVar1 = "";
    break;
  case 0x27:
    pcVar2 = "Expected unquoted string, or single or double quoted string, or index or \'*\'";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string message(int ev) const override
        {
            switch (static_cast<jsonpath_errc>(ev))
            {
                case jsonpath_errc::expected_root_or_current_node:
                    return "Expected '$' or '@'";
                case jsonpath_errc::expected_lbracket_or_dot:
                    return "Expected '[' or '.'";
                case jsonpath_errc::expected_single_quote_or_digit:
                    return "Expected '\'' or digit";
                case jsonpath_errc::expected_root_or_function:
                    return "Expected '$' or function expression";
                case jsonpath_errc::expected_current_node:
                    return "Expected @";
                case jsonpath_errc::expected_rbracket:
                    return "Expected ]";
                case jsonpath_errc::expected_rparen:
                    return "Expected )";
                case jsonpath_errc::expected_slice_start:
                    return "Expected slice start";
                case jsonpath_errc::expected_slice_end:
                    return "Expected slice end";
                case jsonpath_errc::expected_slice_step:
                    return "Expected slice step";
                case jsonpath_errc::expected_separator:
                    return "Expected dot or left bracket separator";
                case jsonpath_errc::expected_forward_slash:
                    return "Invalid path filter, expected '/'";
                case jsonpath_errc::expected_bracket_specifier_or_union:
                    return "Expected index, single or double quoted name, expression, filter, absolute ('$') path or relative ('@') path";
                case jsonpath_errc::invalid_function_name:
                    return "Invalid function name";
                case jsonpath_errc::invalid_argument:
                    return "Invalid argument type";
                case jsonpath_errc::invalid_arity:
                    return "Incorrect number of arguments";
                case jsonpath_errc::function_name_not_found:
                    return "Function name not found";
                case jsonpath_errc::parse_error_in_filter:
                    return "Could not parse JSON expression in a JSONPath filter";
                case jsonpath_errc::argument_parse_error:
                    return "Could not parse JSON expression passed to JSONPath function";
                case jsonpath_errc::unidentified_error:
                    return "Unidentified error";
                case jsonpath_errc::unexpected_eof:
                    return "Unexpected EOF while parsing jsonpath expression";
                case jsonpath_errc::expected_colon_dot_left_bracket_comma_or_rbracket:
                    return "Expected ':', '.', '[', ',', or ']'";
                case jsonpath_errc::argument_to_unflatten_invalid:
                    return "Argument to unflatten must be an object";
                case jsonpath_errc::invalid_flattened_key:
                    return "Flattened key is invalid";
                case jsonpath_errc::step_cannot_be_zero:
                    return "Slice step cannot be zero";
                case jsonpath_errc::invalid_number:
                    return "Invalid number";
                case jsonpath_errc::illegal_escaped_character:
                    return "Illegal escaped character";
                case jsonpath_errc::invalid_codepoint:
                    return "Invalid codepoint";
                case jsonpath_errc::unknown_function:
                    return "Unknown function";
                case jsonpath_errc::invalid_type:
                    return "Invalid type";
                case jsonpath_errc::unbalanced_parentheses:
                    return "Unbalanced parentheses";
                case jsonpath_errc::syntax_error:
                    return "Syntax error";
                case jsonpath_errc::expected_comparator:
                    return "Expected comparator";
                case jsonpath_errc::expected_or:
                    return "Expected operator '||'";
                case jsonpath_errc::expected_and:
                    return "Expected operator '&&'";
                case jsonpath_errc::expected_comma_or_rparen:
                    return "Expected comma or right parenthesis";
                case jsonpath_errc::expected_comma_or_rbracket:
                    return "Expected comma or right bracket";
                case jsonpath_errc::expected_relative_path:
                    return "Expected unquoted string, or single or double quoted string, or index or '*'";
                default:
                    return "Unknown jsonpath parser error";
            }
        }